

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall helics::ValueFederate::~ValueFederate(ValueFederate *this)

{
  ~ValueFederate(this,&VTT);
  Federate::~Federate((Federate *)&this->field_0x10);
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}